

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* jsonnet::internal::line_split(string *s,uint margin)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  ulong in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_260 [16];
  allocator<char> *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffde4;
  string *in_stack_fffffffffffffde8;
  string local_1f8 [32];
  string local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  stringstream local_1a0 [16];
  ostream local_190 [379];
  byte local_15;
  ulong local_10;
  
  local_15 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1deb58);
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __args = local_1b8;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::length();
    if (pbVar1 <= __args) break;
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar2 == '\n') {
      std::__cxx11::stringstream::str();
      strip_ws(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this,__args);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::stringstream::str((string *)local_1a0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
      std::operator<<(local_190,*pcVar2);
    }
    local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_1b8->field_0x1;
  }
  std::__cxx11::stringstream::str();
  strip_ws(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this,__args);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
  std::__cxx11::string::~string(local_260);
  local_15 = 1;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if ((local_15 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  return in_RDI;
}

Assistant:

static std::vector<std::string> line_split(const std::string &s, unsigned margin)
{
    std::vector<std::string> ret;
    std::stringstream ss;
    for (size_t i = 0; i < s.length(); ++i) {
        if (s[i] == '\n') {
            ret.emplace_back(strip_ws(ss.str(), margin));
            ss.str("");
        } else {
            ss << s[i];
        }
    }
    ret.emplace_back(strip_ws(ss.str(), margin));
    return ret;
}